

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O3

void __thiscall Sound_Queue::~Sound_Queue(Sound_Queue *this)

{
  if (this->sound_open == true) {
    SDL_PauseAudio(1);
    SDL_CloseAudio();
  }
  if (this->free_sem != (SDL_sem *)0x0) {
    SDL_DestroySemaphore(this->free_sem);
  }
  if (this->bufs != (sample_t *)0x0) {
    operator_delete__(this->bufs);
    return;
  }
  return;
}

Assistant:

Sound_Queue::~Sound_Queue()
{
	if ( sound_open )
	{
		SDL_PauseAudio( true );
		SDL_CloseAudio();
	}
	
	if ( free_sem )
		SDL_DestroySemaphore( free_sem );
	
	delete [] bufs;
}